

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O1

JSON * phosg::JSON::parse(JSON *__return_storage_ptr__,StringReader *r,bool disable_extensions)

{
  char cVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  uint8_t uVar8;
  int iVar9;
  char *pcVar10;
  string *psVar11;
  dict_type *pdVar12;
  _Move_ctor_base<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
  *this;
  vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>
  *this_00;
  _Uninitialized<std::nullptr_t,_true> this_01;
  size_t sVar13;
  byte *pbVar14;
  parse_error *ppVar15;
  size_t sVar16;
  undefined7 in_register_00000011;
  char cVar17;
  ulong uVar18;
  ulong x;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar19;
  JSON key;
  string data;
  undefined1 local_e8 [16];
  _Variant_storage<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
  local_d8;
  string local_98;
  undefined1 local_78 [48];
  undefined1 local_48 [16];
  double local_38;
  
  local_e8._0_4_ = (int)CONCAT71(in_register_00000011,disable_extensions);
  skip_whitespace_and_comments(r,disable_extensions);
  JSON(__return_storage_ptr__);
  pcVar10 = StringReader::pget<signed_char>(r,r->offset,1);
  cVar17 = *pcVar10;
  if (cVar17 == '[') {
    local_78._0_8_ = (void *)0x0;
    local_78._8_8_ = 0;
    local_78._16_8_ = (_Hash_node_base *)0x0;
    JSON((JSON *)&local_d8,(list_type *)local_78);
    ::std::
    vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
    ::~vector((vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
               *)local_78);
    local_78._0_8_ = __return_storage_ptr__;
    (*::std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>_&>
      ::_S_vtable._M_arr[(long)(char)local_d8._M_index + 1]._M_data)
              ((anon_class_8_1_8991fb9c *)local_78,
               (variant<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                *)&local_d8);
    ::std::__detail::__variant::
    _Variant_storage<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
    ::~_Variant_storage(&local_d8);
    pcVar10 = StringReader::pget<signed_char>(r,r->offset,1);
    cVar17 = '[';
    while( true ) {
      r->offset = r->offset + 1;
      if (*pcVar10 == ']') {
        return __return_storage_ptr__;
      }
      if (cVar17 != *pcVar10) {
        ppVar15 = (parse_error *)__cxa_allocate_exception(0x10);
        sVar16 = StringReader::where(r);
        ::std::__cxx11::to_string((string *)local_78,sVar16);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_d8,"string is not a list; pos=",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_78);
        parse_error::parse_error(ppVar15,(string *)&local_d8);
        __cxa_throw(ppVar15,&parse_error::typeinfo,::std::runtime_error::~runtime_error);
      }
      skip_whitespace_and_comments(r,disable_extensions);
      if ((!disable_extensions) &&
         (pcVar10 = StringReader::pget<signed_char>(r,r->offset,1), *pcVar10 == ']')) break;
      parse((JSON *)&local_d8,r,disable_extensions);
      this_00 = (vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>
                 *)as_list(__return_storage_ptr__);
      this_01._M_storage = operator_new(0x40);
      ::std::__detail::__variant::
      _Move_ctor_base<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
      ::_Move_ctor_base((_Move_ctor_base<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                         *)this_01._M_storage,
                        (_Move_ctor_base<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                         *)&local_d8);
      local_78._0_8_ = this_01._M_storage;
      ::std::
      vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>
      ::emplace_back<phosg::JSON*>(this_00,(JSON **)local_78);
      ::std::__detail::__variant::
      _Variant_storage<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
      ::~_Variant_storage(&local_d8);
      skip_whitespace_and_comments(r,disable_extensions);
      cVar17 = ',';
      pcVar10 = StringReader::pget<signed_char>(r,r->offset,1);
    }
    StringReader::pget<signed_char>(r,r->offset,1);
LAB_0010df00:
    r->offset = r->offset + 1;
    return __return_storage_ptr__;
  }
  if (cVar17 == '{') {
    local_78._0_8_ = local_48;
    local_78._16_8_ = (_Hash_node_base *)0x0;
    local_78._24_8_ = 0;
    local_78._8_8_ = 1;
    local_78._32_8_ = 0x3f800000;
    local_78._40_8_ = 0;
    local_48._0_8_ = (__node_base_ptr)0x0;
    JSON((JSON *)&local_d8,(dict_type *)local_78);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_78);
    local_78._0_8_ = __return_storage_ptr__;
    (*::std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>_&>
      ::_S_vtable._M_arr[(long)(char)local_d8._M_index + 1]._M_data)
              ((anon_class_8_1_8991fb9c *)local_78,
               (variant<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                *)&local_d8);
    ::std::__detail::__variant::
    _Variant_storage<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
    ::~_Variant_storage(&local_d8);
    pcVar10 = StringReader::pget<signed_char>(r,r->offset,1);
    r->offset = r->offset + 1;
    cVar17 = *pcVar10;
    if (cVar17 == '}') {
      return __return_storage_ptr__;
    }
    cVar1 = '{';
    while( true ) {
      if (cVar1 != cVar17) {
        ppVar15 = (parse_error *)__cxa_allocate_exception(0x10);
        sVar16 = StringReader::where(r);
        ::std::__cxx11::to_string((string *)local_78,sVar16);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_d8,"string is not a dictionary; pos=",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_78);
        parse_error::parse_error(ppVar15,(string *)&local_d8);
        __cxa_throw(ppVar15,&parse_error::typeinfo,::std::runtime_error::~runtime_error);
      }
      skip_whitespace_and_comments(r,disable_extensions);
      if ((!disable_extensions) &&
         (pcVar10 = StringReader::pget<signed_char>(r,r->offset,1), *pcVar10 == '}')) break;
      parse((JSON *)&local_d8,r,disable_extensions);
      skip_whitespace_and_comments(r,disable_extensions);
      pcVar10 = StringReader::pget<signed_char>(r,r->offset,1);
      r->offset = r->offset + 1;
      if (*pcVar10 != ':') {
        ppVar15 = (parse_error *)__cxa_allocate_exception(0x10);
        sVar16 = StringReader::where(r);
        ::std::__cxx11::to_string(&local_98,sVar16);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_78,"dictionary does not contain key/value pairs; pos=",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_98);
        parse_error::parse_error(ppVar15,(string *)local_78);
        __cxa_throw(ppVar15,&parse_error::typeinfo,::std::runtime_error::~runtime_error);
      }
      skip_whitespace_and_comments(r,disable_extensions);
      psVar11 = as_string_abi_cxx11_((JSON *)&local_d8);
      parse((JSON *)local_78,r,disable_extensions);
      pdVar12 = as_dict_abi_cxx11_(__return_storage_ptr__);
      this = (_Move_ctor_base<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
              *)operator_new(0x40);
      ::std::__detail::__variant::
      _Move_ctor_base<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
      ::_Move_ctor_base(this,(_Move_ctor_base<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                              *)local_78);
      local_98._M_dataplus._M_p = (pointer)this;
      ::std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::__cxx11::string,phosg::JSON*>(pdVar12,psVar11,&local_98);
      ::std::__detail::__variant::
      _Variant_storage<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
      ::~_Variant_storage((_Variant_storage<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                           *)local_78);
      skip_whitespace_and_comments(r,disable_extensions);
      pcVar10 = StringReader::pget<signed_char>(r,r->offset,1);
      r->offset = r->offset + 1;
      cVar17 = *pcVar10;
      ::std::__detail::__variant::
      _Variant_storage<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
      ::~_Variant_storage(&local_d8);
      cVar1 = ',';
      if (cVar17 == '}') {
        return __return_storage_ptr__;
      }
    }
    StringReader::pget<signed_char>(r,r->offset,1);
    goto LAB_0010df00;
  }
  if (((cVar17 != '+') && (cVar17 != '-')) && (9 < (int)cVar17 - 0x30U)) {
    if (cVar17 == '\"') {
      StringReader::pget<signed_char>(r,r->offset,1);
      r->offset = r->offset + 1;
      local_78._0_8_ = local_78 + 0x10;
      local_78._8_8_ = 0;
      local_78._16_8_ = local_78._16_8_ & 0xffffffffffffff00;
LAB_0010df4e:
      pcVar10 = StringReader::pget<signed_char>(r,r->offset,1);
      if (*pcVar10 == '\"') {
        StringReader::pget<signed_char>(r,r->offset,1);
        r->offset = r->offset + 1;
        JSON((JSON *)&local_d8,(string *)local_78);
        local_98._M_dataplus._M_p = (pointer)__return_storage_ptr__;
        (*::std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>_&>
          ::_S_vtable._M_arr[(long)(char)local_d8._M_index + 1]._M_data)
                  ((anon_class_8_1_8991fb9c *)&local_98,
                   (variant<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                    *)&local_d8);
        ::std::__detail::__variant::
        _Variant_storage<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
        ::~_Variant_storage(&local_d8);
        if ((undefined1 *)local_78._0_8_ == local_78 + 0x10) {
          return __return_storage_ptr__;
        }
        operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
        return __return_storage_ptr__;
      }
      pbVar14 = (byte *)StringReader::pget<signed_char>(r,r->offset,1);
      sVar16 = r->offset + 1;
      r->offset = sVar16;
      bVar3 = *pbVar14;
      if (bVar3 != 0x5c) goto LAB_0010e10f;
      pbVar14 = (byte *)StringReader::pget<signed_char>(r,sVar16,1);
      sVar16 = r->offset + 1;
      r->offset = sVar16;
      bVar3 = *pbVar14;
      if (bVar3 < 0x62) {
        if (((bVar3 != 0x22) && (bVar3 != 0x2f)) && (bVar3 != 0x5c)) goto switchD_0010dfe0_caseD_6f;
        goto LAB_0010e10f;
      }
      switch(bVar3) {
      case 0x6e:
        bVar3 = 10;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x76:
      case 0x77:
switchD_0010dfe0_caseD_6f:
        ppVar15 = (parse_error *)__cxa_allocate_exception(0x10);
        sVar16 = StringReader::where(r);
        ::std::__cxx11::to_string(&local_98,sVar16);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_d8,"invalid escape sequence in string; pos=",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_98);
        parse_error::parse_error(ppVar15,(string *)&local_d8);
        __cxa_throw(ppVar15,&parse_error::typeinfo,::std::runtime_error::~runtime_error);
      case 0x72:
        bVar3 = 0xd;
        break;
      case 0x74:
        bVar3 = 9;
        break;
      case 0x75:
        pcVar10 = StringReader::pget<signed_char>(r,sVar16,1);
        r->offset = r->offset + 1;
        bVar3 = value_for_hex_char(*pcVar10);
        pcVar10 = StringReader::pget<signed_char>(r,r->offset,1);
        r->offset = r->offset + 1;
        bVar5 = value_for_hex_char(*pcVar10);
        pcVar10 = StringReader::pget<signed_char>(r,r->offset,1);
        r->offset = r->offset + 1;
        bVar6 = value_for_hex_char(*pcVar10);
        pcVar10 = StringReader::pget<signed_char>(r,r->offset,1);
        r->offset = r->offset + 1;
        bVar7 = value_for_hex_char(*pcVar10);
        if (0xff < ((uint)bVar6 << 4 | (uint)bVar5 << 8 | (bVar3 & 0xf) << 0xc)) {
          ppVar15 = (parse_error *)__cxa_allocate_exception(0x10);
          sVar16 = StringReader::where(r);
          ::std::__cxx11::to_string(&local_98,sVar16);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_d8,"non-ascii unicode character sequence in string; pos=",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_98);
          parse_error::parse_error(ppVar15,(string *)&local_d8);
          __cxa_throw(ppVar15,&parse_error::typeinfo,::std::runtime_error::~runtime_error);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                   bVar7 | (byte)((uint)bVar6 << 4));
        goto LAB_0010df4e;
      case 0x78:
        goto switchD_0010dfe0_caseD_78;
      default:
        if (bVar3 == 0x62) {
          bVar3 = 8;
        }
        else {
          if (bVar3 != 0x66) goto switchD_0010dfe0_caseD_6f;
          bVar3 = 0xc;
        }
      }
LAB_0010e10f:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,bVar3
                );
      goto LAB_0010df4e;
    }
    bVar4 = StringReader::skip_if(r,"null",4);
    if ((bVar4) || ((!disable_extensions && (bVar4 = StringReader::skip_if(r,"n",1), bVar4)))) {
      JSON((JSON *)&local_d8,(nullptr_t)0x0);
    }
    else {
      bVar4 = StringReader::skip_if(r,"true",4);
      if ((bVar4) || ((!disable_extensions && (bVar4 = StringReader::skip_if(r,"t",1), bVar4)))) {
        JSON((JSON *)&local_d8,true);
      }
      else {
        bVar4 = StringReader::skip_if(r,"false",5);
        if ((!bVar4) && ((disable_extensions || (bVar4 = StringReader::skip_if(r,"f",1), !bVar4))))
        {
          ppVar15 = (parse_error *)__cxa_allocate_exception(0x10);
          sVar16 = StringReader::where(r);
          ::std::__cxx11::to_string((string *)local_78,sVar16);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_d8,"unknown root sentinel; pos=",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_78);
          parse_error::parse_error(ppVar15,(string *)&local_d8);
          __cxa_throw(ppVar15,&parse_error::typeinfo,::std::runtime_error::~runtime_error);
        }
        JSON((JSON *)&local_d8,false);
      }
    }
    operator=(__return_storage_ptr__,(JSON *)&local_d8);
    goto LAB_0010e296;
  }
  if (cVar17 == '-') {
    StringReader::pget<signed_char>(r,r->offset,1);
    r->offset = r->offset + 1;
  }
  if (disable_extensions) {
LAB_0010dc90:
    uVar18 = 0;
    while ((bVar4 = StringReader::eof(r), !bVar4 &&
           (pcVar10 = StringReader::pget<signed_char>(r,r->offset,1), (int)*pcVar10 - 0x30U < 10)))
    {
      pcVar10 = StringReader::pget<signed_char>(r,r->offset,1);
      r->offset = r->offset + 1;
      uVar18 = ((long)*pcVar10 + uVar18 * 10) - 0x30;
    }
    bVar2 = StringReader::eof(r);
    local_e8._0_8_ = (undefined8)(long)uVar18;
    local_e8._8_4_ = extraout_XMM0_Dc;
    local_e8._12_4_ = extraout_XMM0_Dd;
    bVar4 = true;
    if ((!bVar2) && (pcVar10 = StringReader::pget<signed_char>(r,r->offset,1), *pcVar10 == '.')) {
      StringReader::pget<signed_char>(r,r->offset,1);
      r->offset = r->offset + 1;
      local_38 = 0.1;
      while( true ) {
        bVar4 = StringReader::eof(r);
        if ((bVar4) ||
           (pcVar10 = StringReader::pget<signed_char>(r,r->offset,1), 9 < (int)*pcVar10 - 0x30U))
        break;
        pcVar10 = StringReader::pget<signed_char>(r,r->offset,1);
        r->offset = r->offset + 1;
        uVar19 = local_e8._12_4_;
        local_e8._8_4_ = local_e8._8_4_;
        local_e8._0_8_ = (double)local_e8._0_8_ + (double)(*pcVar10 + -0x30) * local_38;
        local_e8._12_4_ = uVar19;
        local_38 = local_38 * 0.1;
      }
      bVar4 = false;
    }
    bVar2 = StringReader::eof(r);
    if ((!bVar2) &&
       (pbVar14 = (byte *)StringReader::pget<signed_char>(r,r->offset,1), (*pbVar14 & 0xdf) == 0x45)
       ) {
      StringReader::pget<signed_char>(r,r->offset,1);
      sVar16 = r->offset + 1;
      r->offset = sVar16;
      pcVar10 = StringReader::pget<signed_char>(r,sVar16,1);
      cVar1 = *pcVar10;
      if ((cVar1 == '+') || (cVar1 == '-')) {
        StringReader::pget<signed_char>(r,r->offset,1);
        r->offset = r->offset + 1;
      }
      iVar9 = 0;
      while ((bVar2 = StringReader::eof(r), !bVar2 &&
             (pcVar10 = StringReader::pget<signed_char>(r,r->offset,1), (int)*pcVar10 - 0x30U < 10))
            ) {
        pcVar10 = StringReader::pget<signed_char>(r,r->offset,1);
        r->offset = r->offset + 1;
        iVar9 = (int)*pcVar10 + iVar9 * 10 + -0x30;
      }
      if (cVar1 == '-') {
        if (0 < iVar9) {
          iVar9 = iVar9 + 1;
          do {
            uVar18 = (ulong)((double)(long)uVar18 * 0.1);
            local_e8._0_8_ = (double)local_e8._0_8_ * 0.1;
            iVar9 = iVar9 + -1;
          } while (1 < iVar9);
        }
      }
      else if (0 < iVar9) {
        iVar9 = iVar9 + 1;
        do {
          uVar18 = uVar18 * 10;
          local_e8._0_8_ = (double)local_e8._0_8_ * 10.0;
          iVar9 = iVar9 + -1;
        } while (1 < iVar9);
      }
    }
  }
  else {
    sVar16 = StringReader::where(r);
    sVar13 = StringReader::size(r);
    if ((sVar13 <= sVar16 + 2) ||
       (pcVar10 = StringReader::pget<signed_char>(r,r->offset,1), *pcVar10 != '0'))
    goto LAB_0010dc90;
    sVar16 = StringReader::where(r);
    pcVar10 = StringReader::pget<signed_char>(r,sVar16 + 1,1);
    if (*pcVar10 != 'x') goto LAB_0010dc90;
    StringReader::where(r);
    StringReader::go(r);
    uVar18 = 0;
    while( true ) {
      bVar2 = StringReader::eof(r);
      bVar4 = true;
      if (bVar2) break;
      pcVar10 = StringReader::pget<signed_char>(r,r->offset,1);
      iVar9 = isxdigit((int)*pcVar10);
      if (iVar9 == 0) break;
      pcVar10 = StringReader::pget<signed_char>(r,r->offset,1);
      r->offset = r->offset + 1;
      bVar3 = value_for_hex_char(*pcVar10);
      uVar18 = uVar18 << 4 | (ulong)bVar3;
    }
  }
  if (bVar4) {
    x = -uVar18;
    if (cVar17 != '-') {
      x = uVar18;
    }
    JSON((JSON *)&local_d8,x);
    local_78._0_8_ = __return_storage_ptr__;
    (*::std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>_&>
      ::_S_vtable._M_arr[(long)(char)local_d8._M_index + 1]._M_data)
              ((anon_class_8_1_8991fb9c *)local_78,
               (variant<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                *)&local_d8);
  }
  else {
    if (cVar17 == '-') {
      local_e8._4_4_ = local_e8._4_4_ ^ 0x80000000;
    }
    JSON((JSON *)&local_d8,(double)CONCAT44(local_e8._4_4_,local_e8._0_4_));
    local_78._0_8_ = __return_storage_ptr__;
    (*::std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>_&>
      ::_S_vtable._M_arr[(long)(char)local_d8._M_index + 1]._M_data)
              ((anon_class_8_1_8991fb9c *)local_78,
               (variant<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                *)&local_d8);
  }
LAB_0010e296:
  ::std::__detail::__variant::
  _Variant_storage<false,_std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
  ::~_Variant_storage(&local_d8);
  return __return_storage_ptr__;
switchD_0010dfe0_caseD_78:
  pcVar10 = StringReader::pget<signed_char>(r,sVar16,1);
  r->offset = r->offset + 1;
  uVar8 = value_for_hex_char(*pcVar10);
  pcVar10 = StringReader::pget<signed_char>(r,r->offset,1);
  r->offset = r->offset + 1;
  bVar3 = value_for_hex_char(*pcVar10);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
             bVar3 | uVar8 << 4);
  goto LAB_0010df4e;
}

Assistant:

JSON JSON::parse(StringReader& r, bool disable_extensions) {
  skip_whitespace_and_comments(r, disable_extensions);

  JSON ret;
  char root_type_ch = r.get_s8(false);
  if (root_type_ch == '{') {
    ret = JSON::dict();
    char expected_separator = '{';
    char separator = r.get_s8();
    while (separator != '}') {
      if (separator != expected_separator) {
        throw parse_error("string is not a dictionary; pos=" + to_string(r.where()));
      }
      expected_separator = ',';

      skip_whitespace_and_comments(r, disable_extensions);
      if (!disable_extensions && (r.get_s8(false) == '}')) {
        r.get_s8();
        break;
      }

      JSON key = JSON::parse(r, disable_extensions);
      skip_whitespace_and_comments(r, disable_extensions);

      if (r.get_s8() != ':') {
        throw parse_error("dictionary does not contain key/value pairs; pos=" + to_string(r.where()));
      }
      skip_whitespace_and_comments(r, disable_extensions);

      ret.emplace(std::move(key.as_string()), JSON::parse(r, disable_extensions));
      skip_whitespace_and_comments(r, disable_extensions);
      separator = r.get_s8();
    }

  } else if (root_type_ch == '[') {
    ret = JSON::list();
    char expected_separator = '[';
    char separator = r.get_s8();
    while (separator != ']') {
      if (separator != expected_separator) {
        throw parse_error("string is not a list; pos=" + to_string(r.where()));
      }
      expected_separator = ',';

      skip_whitespace_and_comments(r, disable_extensions);
      if (!disable_extensions && (r.get_s8(false) == ']')) {
        r.get_s8();
        break;
      }

      ret.emplace_back(JSON::parse(r, disable_extensions));
      skip_whitespace_and_comments(r, disable_extensions);
      separator = r.get_s8();
    }

  } else if (root_type_ch == '-' || root_type_ch == '+' || isdigit(root_type_ch)) {
    int64_t int_data;
    double float_data;
    bool is_int = true;

    bool negative = false;
    if (root_type_ch == '-') {
      negative = true;
      r.get_s8();
    }

    if (!disable_extensions &&
        ((r.where() + 2) < r.size()) &&
        (r.get_s8(false) == '0') &&
        (r.pget_s8(r.where() + 1) == 'x')) { // hex
      r.go(r.where() + 2);

      int_data = 0;
      while (!r.eof() && isxdigit(r.get_s8(false))) {
        int_data = (int_data << 4) | value_for_hex_char(r.get_s8());
      }

    } else { // decimal
      int_data = 0;
      while (!r.eof() && isdigit(r.get_s8(false))) {
        int_data = int_data * 10 + (r.get_s8() - '0');
      }

      double this_place = 0.1;
      float_data = int_data;
      if (!r.eof() && r.get_s8(false) == '.') {
        is_int = false;
        r.get_s8();
        while (!r.eof() && isdigit(r.get_s8(false))) {
          float_data += (r.get_s8() - '0') * this_place;
          this_place *= 0.1;
        }
      }

      char exp_specifier = r.eof() ? '\0' : r.get_s8(false);
      if (exp_specifier == 'e' || exp_specifier == 'E') {
        r.get_s8();
        char sign_char = r.get_s8(false);
        bool e_negative = sign_char == '-';
        if (sign_char == '-' || sign_char == '+') {
          r.get_s8();
        }

        int e = 0;
        while (!r.eof() && isdigit(r.get_s8(false))) {
          e = e * 10 + (r.get_s8() - '0');
        }

        if (e_negative) {
          for (; e > 0; e--) {
            int_data *= 0.1;
            float_data *= 0.1;
          }
        } else {
          for (; e > 0; e--) {
            int_data *= 10;
            float_data *= 10;
          }
        }
      }
    }

    if (negative) {
      int_data = -int_data;
      float_data = -float_data;
    }

    if (is_int) {
      ret = int_data;
    } else {
      ret = float_data;
    }

  } else if (root_type_ch == '\"') {
    r.get_s8();

    string data;
    while (r.get_s8(false) != '\"') {
      char ch = r.get_s8();
      if (ch == '\\') {
        ch = r.get_s8();
        if (ch == '\"') {
          data.push_back('\"');
        } else if (ch == '\\') {
          data.push_back('\\');
        } else if (ch == '/') {
          data.push_back('/');
        } else if (ch == 'b') {
          data.push_back('\b');
        } else if (ch == 'f') {
          data.push_back('\f');
        } else if (ch == 'n') {
          data.push_back('\n');
        } else if (ch == 'r') {
          data.push_back('\r');
        } else if (ch == 't') {
          data.push_back('\t');
        } else if (ch == 'x') {
          uint8_t value;
          try {
            value = value_for_hex_char(r.get_s8()) << 4;
            value |= value_for_hex_char(r.get_s8());
          } catch (const out_of_range&) {
            throw parse_error("incomplete hex escape sequence in string; pos=" + to_string(r.where()));
          }
          data.push_back(value);
        } else if (ch == 'u') {
          uint16_t value;
          try {
            value = value_for_hex_char(r.get_s8()) << 12;
            value |= value_for_hex_char(r.get_s8()) << 8;
            value |= value_for_hex_char(r.get_s8()) << 4;
            value |= value_for_hex_char(r.get_s8());
          } catch (const out_of_range&) {
            throw parse_error("incomplete unicode escape sequence in string; pos=" + to_string(r.where()));
          }
          // TODO: we should eventually be able to support this
          if (value & 0xFF00) {
            throw parse_error("non-ascii unicode character sequence in string; pos=" + to_string(r.where()));
          }
          data.push_back(value);
        } else {
          throw parse_error("invalid escape sequence in string; pos=" + to_string(r.where()));
        }
      } else { // not an escape sequence
        data.push_back(ch);
      }
    }
    r.get_s8();

    ret = std::move(data);

  } else if (r.skip_if("null", 4) || (!disable_extensions && r.skip_if("n", 1))) {
    ret = nullptr;

  } else if (r.skip_if("true", 4) || (!disable_extensions && r.skip_if("t", 1))) {
    ret = true;

  } else if (r.skip_if("false", 5) || (!disable_extensions && r.skip_if("f", 1))) {
    ret = false;

  } else {
    throw parse_error("unknown root sentinel; pos=" + to_string(r.where()));
  }

  return ret;
}